

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pf_filehandle.cc
# Opt level: O0

RC __thiscall
PF_FileHandle::GetPrevPage(PF_FileHandle *this,PageNum current,PF_PageHandle *pageHandle)

{
  int iVar1;
  RC RVar2;
  int rc;
  PF_PageHandle *pageHandle_local;
  PageNum current_local;
  PF_FileHandle *this_local;
  
  if (this->bFileOpen == 0) {
    this_local._4_4_ = 5;
  }
  else if ((current == (this->hdr).numPages) || (iVar1 = IsValidPageNum(this,current), iVar1 != 0))
  {
    for (pageHandle_local._4_4_ = current + -1; -1 < pageHandle_local._4_4_;
        pageHandle_local._4_4_ = pageHandle_local._4_4_ + -1) {
      RVar2 = GetThisPage(this,pageHandle_local._4_4_,pageHandle);
      if (RVar2 == 0) {
        return 0;
      }
      if (RVar2 != 3) {
        return RVar2;
      }
    }
    this_local._4_4_ = 8;
  }
  else {
    this_local._4_4_ = 3;
  }
  return this_local._4_4_;
}

Assistant:

RC PF_FileHandle::GetPrevPage(PageNum current, PF_PageHandle &pageHandle) const
{
   int rc;               // return code

   // File must be open
   if (!bFileOpen)
      return (PF_CLOSEDFILE);

   // Validate page number (note that hdr.numPages is acceptable here)
   if (current != hdr.numPages &&  !IsValidPageNum(current))
      return (PF_INVALIDPAGE);

   // Scan the file until a valid used page is found
   for (current--; current >= 0; current--) {

      // If this is a valid (used) page, we're done
      if (!(rc = GetThisPage(current, pageHandle)))
         return (0);

      // If unexpected error, return it
      if (rc != PF_INVALIDPAGE)
         return (rc);
   }

   // No valid (used) page found
   return (PF_EOF);
}